

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O0

float * stbi_loadf(char *filename,int *x,int *y,int *comp,int req_comp)

{
  FILE *__stream;
  FILE *f;
  float *result;
  int req_comp_local;
  int *comp_local;
  int *y_local;
  int *x_local;
  char *filename_local;
  
  __stream = (FILE *)stbi__fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    stbi__err("can\'t fopen");
    filename_local = (char *)0x0;
  }
  else {
    filename_local = (char *)stbi_loadf_from_file((FILE *)__stream,x,y,comp,req_comp);
    fclose(__stream);
  }
  return (float *)filename_local;
}

Assistant:

STBIDEF float *stbi_loadf(char const *filename, int *x, int *y, int *comp, int req_comp)
{
   float *result;
   FILE *f = stbi__fopen(filename, "rb");
   if (!f) return stbi__errpf("can't fopen", "Unable to open file");
   result = stbi_loadf_from_file(f,x,y,comp,req_comp);
   fclose(f);
   return result;
}